

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Functional::FrontFacingCase::iterate(FrontFacingCase *this)

{
  RenderContext *pRVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  TestError *this_00;
  byte bVar6;
  int x;
  uint x_00;
  uint y;
  int iVar7;
  char *description;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  RGBA threshold;
  Surface refImg;
  Surface testImg;
  deUint16 indicesCW [6];
  deUint16 indicesCCW [6];
  float positions [16];
  ProgramSources sources;
  Random rnd;
  ShaderProgram program;
  RGBA local_2dc;
  Surface local_2d8;
  undefined1 local_2c0 [8];
  char *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined4 local_298;
  TestLog *local_290;
  Surface local_288;
  TextureFormat local_270;
  long local_268;
  long local_260 [2];
  long local_250;
  undefined8 local_248;
  undefined4 local_240;
  undefined8 local_238;
  undefined4 local_230;
  value_type local_228;
  undefined1 *local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  pointer pbStack_1a8;
  int local_1a0;
  value_type *local_198;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_150;
  undefined1 local_130 [32];
  deRandom local_110;
  ShaderProgram local_100;
  
  local_290 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_250 = CONCAT44(extraout_var,iVar3);
  deRandom_init(&local_110,0x89f2c);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar5->m_width;
  if (0x3f < iVar3) {
    iVar3 = 0x40;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = 0x40;
  if (pRVar5->m_height < 0x40) {
    iVar7 = pRVar5->m_height;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar5->m_width;
  dVar4 = deRandom_getUint32(&local_110);
  x_00 = dVar4 % ((iVar8 - iVar3) + 1U);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar5->m_height;
  dVar4 = deRandom_getUint32(&local_110);
  y = dVar4 % ((iVar8 - iVar7) + 1U);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = (pRVar5->m_pixelFormat).alphaBits;
  uVar12 = 0x1000000 << (8U - (char)iVar8 & 0x1f);
  bVar6 = 8 - (char)(pRVar5->m_pixelFormat).redBits;
  if (iVar8 < 1) {
    uVar12 = 0;
  }
  uVar11 = 0x100 << (8U - (char)(pRVar5->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar6 & 0x1f);
  uVar12 = 0x10000 << (8U - (char)(pRVar5->m_pixelFormat).blueBits & 0x1f) | uVar11 | uVar12;
  uVar10 = 1 << (bVar6 & 0x1f) & 0xff;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  uVar11 = uVar11 >> 8 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar9 = uVar12 >> 0x10 & 0xff;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  uVar12 = uVar12 >> 0x18;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  local_2dc.m_value = uVar12 * 0x1000000 + (uVar9 << 0x10 | uVar11 << 8 | uVar10) + 0x1010101;
  tcu::Surface::Surface(&local_288,iVar3,iVar7);
  tcu::Surface::Surface(&local_2d8,iVar3,iVar7);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_2c0 = (undefined1  [8])&local_2b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\tif (gl_FrontFacing)\n\t\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\to_color = vec4(0.0, 0.0, 1.0, 1.0);\n}\n"
             ,"");
  local_130[0x10] = 0;
  local_130._17_8_ = 0;
  local_130._0_8_ = (pointer)0x0;
  local_130[8] = 0;
  local_130._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1e0,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e0,&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c8,(value_type *)local_2c0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar1,(ProgramSources *)local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_150);
  lVar13 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e0 + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
  if (local_2c0 != (undefined1  [8])&local_2b0) {
    operator_delete((void *)local_2c0,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(local_290,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_1e0 = (undefined1  [8])local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"Compile failed","");
    tcu::TestError::TestError(this_00,(string *)local_1e0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1f8 = 0xbf8000003f800000;
  uStack_1f0 = 0x3f80000000000000;
  local_208 = &DAT_3f8000003f800000;
  uStack_200 = 0x3f80000000000000;
  local_228.field_2._M_allocated_capacity = 0xbf800000bf800000;
  local_228.field_2._8_8_ = 0x3f80000000000000;
  local_228._M_dataplus._M_p = (pointer)0x3f800000bf800000;
  local_228._M_string_length._0_4_ = 0;
  local_228._M_string_length._4_4_ = 0x3f800000;
  local_238 = 0x2000200010000;
  local_230 = 0x30001;
  local_248 = 0x3000000010002;
  local_240 = 0x20001;
  local_270 = (TextureFormat)local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"a_position","");
  local_2c0._0_4_ = A;
  local_2b8 = local_2b0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_270,local_268 + (long)local_270);
  local_298 = 0;
  local_1e0._0_4_ = local_2c0._0_4_;
  local_1d8._M_p = (pointer)&local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_2b8,local_2b8 + local_2b0._M_allocated_capacity);
  local_1c8.field_2._M_allocated_capacity._0_4_ = local_298;
  local_1c8.field_2._8_8_ = 8;
  pbStack_1a8 = (pointer)0x400000004;
  local_1a0 = 0;
  local_198 = &local_228;
  if (local_2b8 != local_2b0._M_local_buf + 8) {
    operator_delete(local_2b8,local_2b0._8_8_ + 1);
  }
  lVar13 = local_250;
  if (local_270 != (TextureFormat)local_260) {
    operator_delete((void *)local_270,local_260[0] + 1);
  }
  (**(code **)(lVar13 + 0x1680))(local_100.m_program.m_program);
  iVar8 = iVar3 / 2;
  (**(code **)(lVar13 + 0x1a00))(x_00,y,iVar8,iVar7);
  local_2c0._0_4_ = R;
  local_2c0._4_4_ = UNORM_INT32;
  local_2b8._0_4_ = INDEXTYPE_UINT16;
  local_2b0._M_allocated_capacity = (size_type)&local_238;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
            (VertexArrayBinding *)local_1e0,(PrimitiveList *)local_2c0,(DrawUtilCallback *)0x0);
  (**(code **)(lVar13 + 0x1a00))(x_00 + iVar8,y,iVar3 - iVar8,iVar7);
  local_2c0._0_4_ = R;
  local_2c0._4_4_ = UNORM_INT32;
  local_2b8 = (char *)CONCAT44(local_2b8._4_4_,1);
  local_2b0._M_allocated_capacity = (size_type)&local_248;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
            (VertexArrayBinding *)local_1e0,(PrimitiveList *)local_2c0,(DrawUtilCallback *)0x0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_270.order = RGBA;
  local_270.type = UNORM_INT8;
  if ((void *)local_288.m_pixels.m_cap != (void *)0x0) {
    local_288.m_pixels.m_cap = (size_t)local_288.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_2c0,&local_270,local_288.m_width,local_288.m_height,1,
             (void *)local_288.m_pixels.m_cap);
  glu::readPixels(pRVar1,x_00,y,(PixelBufferAccess *)local_2c0);
  dVar4 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar4,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x29a);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._M_p !=
      &local_1c8) {
    operator_delete(local_1d8._M_p,(ulong)(local_1c8._M_dataplus._M_p + 1));
  }
  if (0 < local_2d8.m_height) {
    iVar3 = 0;
    do {
      if (local_2d8.m_width < 2) {
        iVar7 = local_2d8.m_width / 2;
      }
      else {
        iVar8 = 0;
        do {
          *(undefined4 *)
           ((long)local_2d8.m_pixels.m_ptr + (long)(local_2d8.m_width * iVar3 + iVar8) * 4) =
               0xff00ff00;
          iVar8 = iVar8 + 1;
          iVar7 = local_2d8.m_width / 2;
        } while (iVar8 < iVar7);
      }
      for (; iVar7 < local_2d8.m_width; iVar7 = iVar7 + 1) {
        *(undefined4 *)
         ((long)local_2d8.m_pixels.m_ptr + (long)(local_2d8.m_width * iVar3 + iVar7) * 4) =
             0xffff0000;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_2d8.m_height);
  }
  bVar2 = tcu::pixelThresholdCompare
                    (local_290,"Result","Image comparison result",&local_2d8,&local_288,&local_2dc,
                     COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,description
            );
  glu::ShaderProgram::~ShaderProgram(&local_100);
  tcu::Surface::~Surface(&local_2d8);
  tcu::Surface::~Surface(&local_288);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		// Test case renders two adjecent quads, where left is has front-facing
		// triagles and right back-facing. Color is selected based on gl_FrontFacing
		// value.

		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		de::Random				rnd			(0x89f2c);
		const int				width		= de::min(64, m_context.getRenderTarget().getWidth());
		const int				height		= de::min(64, m_context.getRenderTarget().getHeight());
		const int				viewportX	= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
		const int				viewportY	= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	if (gl_FrontFacing)\n"
			"		o_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		o_color = vec4(0.0, 0.0, 1.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-1.0f,  1.0f, 0.0f, 1.0f,
				-1.0f, -1.0f, 0.0f, 1.0f,
				 1.0f,  1.0f, 0.0f, 1.0f,
				 1.0f, -1.0f, 0.0f, 1.0f
			};
			const deUint16 indicesCCW[]	= { 0, 1, 2, 2, 1, 3 };
			const deUint16 indicesCW[]	= { 2, 1, 0, 3, 1, 2 };

			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());

			gl.viewport(viewportX, viewportY, width/2, height);
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indicesCCW), &indicesCCW[0]));

			gl.viewport(viewportX + width/2, viewportY, width-width/2, height);
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indicesCW), &indicesCW[0]));

			glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth()/2; x++)
				refImg.setPixel(x, y, tcu::RGBA::green());

			for (int x = refImg.getWidth()/2; x < refImg.getWidth(); x++)
				refImg.setPixel(x, y, tcu::RGBA::blue());
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}